

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

int proxy_conn_stop(proxy_conn_handle *pc)

{
  void *pvVar1;
  int iVar2;
  int local_20;
  int final_ret;
  int ret;
  proxy_conn_priv *priv;
  proxy_conn_handle *pc_local;
  
  pvVar1 = pc->priv;
  local_20 = 0;
  proxy_conn_finish(pc);
  iVar2 = worker_join((worker_handle *)((long)pvVar1 + 0xb8));
  if (iVar2 < 0) {
    local_20 = iVar2;
  }
  iVar2 = worker_join((worker_handle *)((long)pvVar1 + 0x98));
  if (iVar2 < 0) {
    local_20 = iVar2;
  }
  iVar2 = worker_join((worker_handle *)((long)pvVar1 + 0x78));
  if (iVar2 < 0) {
    local_20 = iVar2;
  }
  return local_20;
}

Assistant:

int proxy_conn_stop(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	int ret;
	int final_ret = 0;

	proxy_conn_finish(pc);

	ret = worker_join(&priv->worker_tcp);
	if (ret < 0)
		final_ret = ret;

	ret = worker_join(&priv->worker_data);
	if (ret < 0)
		final_ret = ret;

	ret = worker_join(&priv->worker_control);
	if (ret < 0)
		final_ret = ret;

	return final_ret;
}